

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O0

void setTransformation(Transformation *t)

{
  reference pvVar1;
  char *__path;
  double dVar2;
  Transformation *t_local;
  
  if ((t->enable & 1U) != 0) {
    std::vector<double,_std::allocator<double>_>::resize(&t->mat,4);
    t->rot = (pi / 180.0) * t->rot;
    dVar2 = cos(t->rot);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&t->mat,0);
    *pvVar1 = dVar2;
    dVar2 = sin(t->rot);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&t->mat,1);
    *pvVar1 = -dVar2;
    dVar2 = sin(t->rot);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&t->mat,2);
    *pvVar1 = dVar2;
    dVar2 = cos(t->rot);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&t->mat,3);
    *pvVar1 = dVar2;
    __path = (char *)std::__cxx11::string::c_str();
    mkdir(__path,0x1ff);
  }
  return;
}

Assistant:

void setTransformation(Transformation& t)
{
	if (t.enable)
	{
		t.mat.resize(4);

		// Get rotation matrix
		t.rot *= pi / 180.0;  // degrees to radians
		t.mat[0] =  std::cos(t.rot);
		t.mat[1] = -std::sin(t.rot);
		t.mat[2] =  std::sin(t.rot);
		t.mat[3] =  std::cos(t.rot);

		// Make output directory
		#if defined(_WIN32) || defined(_WIN64)
			_mkdir(t.outdir.c_str());
		#else
			mkdir(t.outdir.c_str(), 0777);
		#endif
	}
}